

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

string * __thiscall
wabt::interp::Thread::TraceSource::Pick_abi_cxx11_
          (string *__return_storage_ptr__,TraceSource *this,Index index,Instr instr)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  u64 uVar4;
  u64 uVar5;
  ValueType VVar6;
  Value *pVVar7;
  char *pcVar8;
  double dVar9;
  Enum aEStack_50 [8];
  
  pVVar7 = Thread::Pick(this->thread_,index);
  fVar1 = (float)pVVar7->f32_;
  uVar2 = *(uint *)((pVVar7->v128_).v + 4);
  uVar5 = pVVar7->i64_;
  dVar9 = (double)pVVar7->i64_;
  uVar4 = pVVar7->i64_;
  uVar3 = *(ulong *)((pVVar7->v128_).v + 8);
  Opcode::GetInfo(&instr.op);
  VVar6.enum_ = aEStack_50[(int)index];
  if (VVar6.enum_ == Void) {
    if ((instr.op.enum_ - TableSet < 4) && (instr.op.enum_ - TableSet != 2)) {
      VVar6.enum_ = *(Enum *)&(this->thread_->mod_->desc_).tables.
                              super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start[instr.field_2.imm_u32].type.
                              super_ExternType.field_0xc;
    }
    else if (instr.op.enum_ - LocalSet < 2) {
      VVar6 = GetLocalType(this,instr.field_2.imm_u32);
    }
    else {
      if (instr.op.enum_ != GlobalSet) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?","");
        return __return_storage_ptr__;
      }
      VVar6.enum_ = *(Enum *)&(this->thread_->mod_->desc_).globals.
                              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start[instr.field_2.imm_u32].type.
                              super_ExternType.field_0xc;
    }
  }
  switch(VVar6.enum_) {
  case Nullref:
    pcVar8 = "nullref";
    break;
  case Anyref:
    pcVar8 = "anyref";
    break;
  case Funcref:
    pcVar8 = "funcref";
    break;
  case 0xfffffff1:
  case Funcref|Hostref:
  case 0xfffffff3:
  case Funcref|I8U:
  case 0xfffffff5:
  case Funcref|I16U:
  case Funcref|I32U:
  case ~I32U:
  case I16:
  case I8:
switchD_00245c98_caseD_fffffff1:
    abort();
  case V128:
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"0x%08x 0x%08x 0x%08x 0x%08x",(ulong)(uint)fVar1,(ulong)uVar2,
               uVar3,uVar3 >> 0x20);
    return __return_storage_ptr__;
  case F64:
    goto LAB_00245d35;
  case F32:
    dVar9 = (double)fVar1;
LAB_00245d35:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g",dVar9);
    return __return_storage_ptr__;
  case I64:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%lu",uVar4);
    return __return_storage_ptr__;
  case I32:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%u",(ulong)(uint)fVar1);
    return __return_storage_ptr__;
  default:
    if (VVar6.enum_ != Exnref) goto switchD_00245c98_caseD_fffffff1;
    pcVar8 = "exnref";
  }
  StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:%zd",pcVar8,uVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string Thread::TraceSource::Pick(Index index, Instr instr) {
  Value val = thread_->Pick(index);
  const char* reftype;
  // TODO: the opcode index and pick index go in opposite directions.
  auto type = instr.op.GetParamType(index);
  if (type == ValueType::Void) {
    // Void should never be displayed normally; we only expect to see it when
    // the stack may have different a different type. This is likely to occur
    // with an index; try to see which type we should expect.
    switch (instr.op) {
      case Opcode::GlobalSet: type = GetGlobalType(instr.imm_u32); break;
      case Opcode::LocalSet:
      case Opcode::LocalTee:  type = GetLocalType(instr.imm_u32); break;
      case Opcode::TableSet:
      case Opcode::TableGrow:
      case Opcode::TableFill: type = GetTableElementType(instr.imm_u32); break;
      default: return "?";
    }
  }

  switch (type) {
    case ValueType::I32: return StringPrintf("%u", val.Get<u32>());
    case ValueType::I64: return StringPrintf("%" PRIu64, val.Get<u64>());
    case ValueType::F32: return StringPrintf("%g", val.Get<f32>());
    case ValueType::F64: return StringPrintf("%g", val.Get<f64>());
    case ValueType::V128: {
      auto v = val.Get<v128>();
      return StringPrintf("0x%08x 0x%08x 0x%08x 0x%08x", v.u32(0), v.u32(1),
                          v.u32(2), v.u32(3));
    }

    case ValueType::Nullref: reftype = "nullref"; break;
    case ValueType::Funcref: reftype = "funcref"; break;
    case ValueType::Exnref:  reftype = "exnref"; break;
    case ValueType::Anyref:  reftype = "anyref"; break;

    default:
      WABT_UNREACHABLE;
      break;
  }

  // Handle ref types.
  return StringPrintf("%s:%" PRIzd, reftype, val.Get<Ref>().index);
}